

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::ConvertToPsbtRequest,cfd::js::api::json::PsbtOutputData,cfd::js::api::ConvertToPsbtRequestStruct,cfd::js::api::PsbtOutputDataStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::PsbtOutputDataStruct_(const_cfd::js::api::ConvertToPsbtRequestStruct_&)>
          *call_function)

{
  json *pjVar1;
  undefined8 uVar2;
  PsbtOutputDataStruct response;
  PsbtOutputData res;
  ConvertToPsbtRequestStruct request;
  ConvertToPsbtRequest req;
  string local_298;
  PsbtOutputDataStruct local_278;
  ErrorResponse local_190;
  ConvertToPsbtRequestStruct local_d8;
  ConvertToPsbtRequest local_80;
  
  ConvertToPsbtRequest::ConvertToPsbtRequest(&local_80);
  core::JsonClassBase<cfd::js::api::json::ConvertToPsbtRequest>::Deserialize
            (&local_80.super_JsonClassBase<cfd::js::api::json::ConvertToPsbtRequest>,(string *)this)
  ;
  ConvertToPsbtRequest::ConvertToStruct(&local_d8,&local_80);
  if ((request_message->field_2)._M_allocated_capacity != 0) {
    (**(code **)((long)&request_message->field_2 + 8))(&local_278,request_message,&local_d8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if (local_278.error.code == 0) {
      PsbtOutputData::PsbtOutputData((PsbtOutputData *)&local_190);
      PsbtOutputData::ConvertFromStruct((PsbtOutputData *)&local_190,&local_278);
      core::JsonClassBase<cfd::js::api::json::PsbtOutputData>::Serialize_abi_cxx11_
                (&local_298,(JsonClassBase<cfd::js::api::json::PsbtOutputData> *)&local_190);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      PsbtOutputData::~PsbtOutputData((PsbtOutputData *)&local_190);
    }
    else {
      ErrorResponse::ConvertFromStruct(&local_190,&local_278.error);
      core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
                (&local_298,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&local_190);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      local_190.super_ErrorResponseBase.super_JsonClassBase<cfd::js::api::json::ErrorResponseBase>.
      _vptr_JsonClassBase = (_func_int **)&PTR__ErrorResponseBase_00a78a38;
      InnerErrorResponse::~InnerErrorResponse(&local_190.super_ErrorResponseBase.error_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_190.super_ErrorResponseBase.ignore_items._M_t);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_278.ignore_items._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_278.error.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.error.message._M_dataplus._M_p != &local_278.error.message.field_2) {
      operator_delete(local_278.error.message._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.error.type._M_dataplus._M_p != &local_278.error.type.field_2) {
      operator_delete(local_278.error.type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.hex._M_dataplus._M_p != &local_278.hex.field_2) {
      operator_delete(local_278.hex._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.psbt._M_dataplus._M_p != &local_278.psbt.field_2) {
      operator_delete(local_278.psbt._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_d8.ignore_items._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8.tx._M_dataplus._M_p != &local_d8.tx.field_2) {
      operator_delete(local_d8.tx._M_dataplus._M_p);
    }
    ConvertToPsbtRequest::~ConvertToPsbtRequest(&local_80);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_bad_function_call();
  PsbtOutputData::~PsbtOutputData((PsbtOutputData *)&local_190);
  pjVar1 = (json *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if (pjVar1 != this) {
    operator_delete(pjVar1);
  }
  PsbtOutputDataStruct::~PsbtOutputDataStruct(&local_278);
  ConvertToPsbtRequestStruct::~ConvertToPsbtRequestStruct(&local_d8);
  ConvertToPsbtRequest::~ConvertToPsbtRequest(&local_80);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}